

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O0

void __thiscall optimization::livevar_analyse::Livevar_Analyse::roll_phi(Livevar_Analyse *this)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  size_type sVar4;
  key_type *in_RDI;
  iterator iter;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *in_stack_ffffffffffffff98;
  key_type *in_stack_ffffffffffffffa0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = *(long *)&in_RDI[6].id + 0x68;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_ffffffffffffff98);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_ffffffffffffff98);
LAB_0014cbbe:
  bVar1 = std::operator!=(&local_18,&local_20);
  if (!bVar1) {
    return;
  }
  local_28 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x14cbe0);
  local_30._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin(in_stack_ffffffffffffff98);
LAB_0014cbfc:
  do {
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::end(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator->(&local_30);
    pIVar3 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        in_stack_ffffffffffffffa0);
    iVar2 = (*(pIVar3->super_Displayable)._vptr_Displayable[1])();
    if (iVar2 == 0) {
      in_stack_ffffffffffffffa0 = in_RDI + 3;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator->(&local_30);
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_ffffffffffffffa0);
      sVar4 = std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)in_stack_ffffffffffffffb0._M_current,in_RDI);
      if (sVar4 != 0) {
        in_stack_ffffffffffffff98 = &(local_28->second).inst;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
        ::__normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                  ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    *)in_stack_ffffffffffffffa0,
                   (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    *)in_stack_ffffffffffffff98);
        local_30._M_current =
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             std::
             vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffb8);
        goto LAB_0014cbfc;
      }
    }
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
         ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                       *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  } while( true );
  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
             in_stack_ffffffffffffffa0);
  goto LAB_0014cbbe;
}

Assistant:

void roll_phi() {
    for (auto& blkpair : func.basic_blks) {
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        if (iter->get()->inst_kind() == mir::inst::InstKind::Assign &&
            phi_dests.count(iter->get()->dest)) {
          iter = blkpair.second.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
  }